

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringManip_anagramDeletion.cpp
# Opt level: O2

int main(void)

{
  int iVar1;
  ostream *poVar2;
  string b;
  string a;
  undefined1 *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined8 local_60;
  undefined1 local_58 [16];
  string local_48;
  string local_28;
  
  local_68 = local_58;
  local_60 = 0;
  local_58[0] = 0;
  local_88 = local_78;
  local_80 = 0;
  local_78[0] = 0;
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_68);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)&std::cin,(string *)&local_88);
  std::__cxx11::string::string((string *)&local_28,(string *)&local_68);
  std::__cxx11::string::string((string *)&local_48,(string *)&local_88);
  iVar1 = makeAnagram(&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  return 0;
}

Assistant:

int main()
{
	string a,b;
	getline(cin,a);
	getline(cin,b);
	int result = makeAnagram(a,b);
	cout<<result<<endl;
	return 0;
}